

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::val::ValidationState_t::AddOrderedInstruction
          (ValidationState_t *this,spv_parsed_instruction_t *inst)

{
  reference pvVar1;
  size_type pos;
  spv_parsed_instruction_t *local_18;
  spv_parsed_instruction_t *inst_local;
  ValidationState_t *this_local;
  
  local_18 = inst;
  inst_local = (spv_parsed_instruction_t *)this;
  std::vector<spvtools::val::Instruction,std::allocator<spvtools::val::Instruction>>::
  emplace_back<spv_parsed_instruction_t_const*&>
            ((vector<spvtools::val::Instruction,std::allocator<spvtools::val::Instruction>> *)
             &this->ordered_instructions_,&local_18);
  pvVar1 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
           back(&this->ordered_instructions_);
  pos = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::size
                  (&this->ordered_instructions_);
  Instruction::SetLineNum(pvVar1,pos);
  pvVar1 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
           back(&this->ordered_instructions_);
  return pvVar1;
}

Assistant:

Instruction* ValidationState_t::AddOrderedInstruction(
    const spv_parsed_instruction_t* inst) {
  ordered_instructions_.emplace_back(inst);
  ordered_instructions_.back().SetLineNum(ordered_instructions_.size());
  return &ordered_instructions_.back();
}